

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

uint8_t * google::protobuf::internal::WireFormat::_InternalSerialize
                    (Message *message,uint8_t *target,EpsCopyOutputStream *stream)

{
  pointer ppFVar1;
  Descriptor *pDVar2;
  UnknownFieldSet *pUVar3;
  uint8_t *puVar4;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range2;
  long lVar5;
  long lVar6;
  pointer ppFVar7;
  Metadata MVar8;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_58;
  Reflection *local_40;
  FieldDescriptor *local_38;
  
  MVar8 = Message::GetMetadata(message);
  pDVar2 = MVar8.descriptor;
  MVar8 = Message::GetMetadata(message);
  local_40 = MVar8.reflection;
  local_58.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((pDVar2->options_->field_0)._impl_.map_entry_ == true) {
    ppFVar7 = local_58.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppFVar1 = local_58.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (0 < pDVar2->field_count_) {
      lVar5 = 0;
      lVar6 = 0;
      do {
        local_38 = (FieldDescriptor *)(&pDVar2->fields_->super_SymbolBase + lVar5);
        std::
        vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
        ::emplace_back<google::protobuf::FieldDescriptor_const*>
                  ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                    *)&local_58,&local_38);
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 0x58;
        ppFVar7 = local_58.
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppFVar1 = local_58.
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      } while (lVar6 < pDVar2->field_count_);
    }
  }
  else {
    Reflection::ListFields(local_40,message,&local_58);
    ppFVar7 = local_58.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppFVar1 = local_58.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  for (; ppFVar7 != ppFVar1; ppFVar7 = ppFVar7 + 1) {
    target = InternalSerializeField(*ppFVar7,message,target,stream);
  }
  if ((pDVar2->options_->field_0)._impl_.message_set_wire_format_ == true) {
    pUVar3 = Reflection::GetUnknownFields(local_40,message);
    puVar4 = InternalSerializeUnknownMessageSetItemsToArray(pUVar3,target,stream);
  }
  else {
    pUVar3 = Reflection::GetUnknownFields(local_40,message);
    puVar4 = InternalSerializeUnknownFieldsToArray(pUVar3,target,stream);
  }
  if (local_58.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return puVar4;
}

Assistant:

uint8_t* WireFormat::_InternalSerialize(const Message& message, uint8_t* target,
                                        io::EpsCopyOutputStream* stream) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* message_reflection = message.GetReflection();

  std::vector<const FieldDescriptor*> fields;

  // Fields of map entry should always be serialized.
  if (descriptor->options().map_entry()) {
    for (int i = 0; i < descriptor->field_count(); i++) {
      fields.push_back(descriptor->field(i));
    }
  } else {
    message_reflection->ListFields(message, &fields);
  }

  for (auto field : fields) {
    target = InternalSerializeField(field, message, target, stream);
  }

  if (descriptor->options().message_set_wire_format()) {
    return InternalSerializeUnknownMessageSetItemsToArray(
        message_reflection->GetUnknownFields(message), target, stream);
  } else {
    return InternalSerializeUnknownFieldsToArray(
        message_reflection->GetUnknownFields(message), target, stream);
  }
}